

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_texture2d * rf_get_default_texture(void)

{
  rf_texture2d *in_RDI;
  
  in_RDI->id = 0;
  in_RDI->width = 0;
  in_RDI->height = 0;
  in_RDI->mipmaps = 0;
  in_RDI->format = 0;
  in_RDI->valid = false;
  *(undefined3 *)&in_RDI->field_0x15 = 0;
  in_RDI->id = (rf__ctx->field_0).default_texture_id;
  in_RDI->width = 1;
  in_RDI->height = 1;
  in_RDI->mipmaps = 1;
  in_RDI->format = RF_UNCOMPRESSED_R8G8B8A8;
  return in_RDI;
}

Assistant:

RF_API rf_texture2d rf_get_default_texture()
{
    rf_texture2d texture = {0};
    texture.id = rf_ctx.default_texture_id;
    texture.width = 1;
    texture.height = 1;
    texture.mipmaps = 1;
    texture.format = RF_UNCOMPRESSED_R8G8B8A8;

    return texture;
}